

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.h
# Opt level: O0

TCGv_i32 get_ahp_flag(TCGContext_conflict1 *tcg_ctx)

{
  TCGv_i32 ret_00;
  TCGv_i32 ret;
  TCGContext_conflict1 *tcg_ctx_local;
  
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_ld_i32(tcg_ctx,ret_00,tcg_ctx->cpu_env,0x2e6c);
  tcg_gen_extract_i32_aarch64(tcg_ctx,ret_00,ret_00,0x1a,1);
  return ret_00;
}

Assistant:

static inline TCGv_i32 get_ahp_flag(TCGContext *tcg_ctx)
{
    TCGv_i32 ret = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_ld_i32(tcg_ctx, ret, tcg_ctx->cpu_env,
                   offsetof(CPUARMState, vfp.xregs[ARM_VFP_FPSCR]));
    tcg_gen_extract_i32(tcg_ctx, ret, ret, 26, 1);

    return ret;
}